

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct32_stage7_sse4_1
               (__m128i *bf1,__m128i *cospim32,__m128i *cospi32,__m128i *clamp_lo,__m128i *clamp_hi,
               __m128i *rounding,int bit)

{
  longlong in_RCX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  long in_RDI;
  __m128i *in_R8;
  __m128i *palVar1;
  __m128i *in_R9;
  __m128i *palVar2;
  __m128i *out1;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  __m128i *extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  __m128i *extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  __m128i in0_07;
  __m128i in0_08;
  __m128i in0_09;
  __m128i in0_10;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i in1_07;
  __m128i in1_08;
  __m128i in1_09;
  __m128i in1_10;
  __m128i temp2;
  __m128i temp1;
  __m128i *in_stack_ffffffffffffffa8;
  __m128i *in_stack_ffffffffffffffb0;
  
  in0[1] = in_RDI + 0x70;
  in0[0] = in_RDI;
  in1[1] = (longlong)in_R8;
  in1[0] = in_RCX;
  palVar1 = in_R8;
  palVar2 = in_R9;
  addsub_sse4_1(in0,in1,in_R8,in_R9,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  in0_00[0] = in_RDI + 0x10;
  in0_00[1] = in_RDI + 0x60;
  in1_00[1] = (longlong)in_R8;
  in1_00[0] = in_RCX;
  addsub_sse4_1(in0_00,in1_00,palVar1,palVar2,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  in0_01[0] = in_RDI + 0x20;
  in0_01[1] = in_RDI + 0x50;
  in1_01[1] = (longlong)in_R8;
  in1_01[0] = in_RCX;
  addsub_sse4_1(in0_01,in1_01,palVar1,palVar2,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  in0_02[0] = in_RDI + 0x30;
  in0_02[1] = in_RDI + 0x40;
  in1_02[1] = (longlong)in_R8;
  in1_02[0] = in_RCX;
  addsub_sse4_1(in0_02,in1_02,palVar1,palVar2,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0xa0),in_RDX,(__m128i *)(in_RDI + 0xd0),in_R9,
                  (uint)temp2[1]);
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0xa0),in_RDX,(__m128i *)(in_RDI + 0xd0),in_R9,
                  (uint)temp2[1]);
  *(undefined8 *)(in_RDI + 0xd0) = extraout_XMM0_Qa_00;
  *(undefined8 *)(in_RDI + 0xd8) = extraout_XMM0_Qb_00;
  *(undefined8 *)(in_RDI + 0xa0) = extraout_XMM0_Qa;
  *(undefined8 *)(in_RDI + 0xa8) = extraout_XMM0_Qb;
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0xb0),in_RDX,(__m128i *)(in_RDI + 0xc0),in_R9,
                  (uint)temp2[1]);
  out1 = (__m128i *)(ulong)(uint)temp2[1];
  palVar1 = extraout_XMM0_Qa_01;
  palVar2 = extraout_XMM0_Qb_01;
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0xb0),in_RDX,(__m128i *)(in_RDI + 0xc0),in_R9,
                  (uint)temp2[1]);
  *(undefined8 *)(in_RDI + 0xc0) = extraout_XMM0_Qa_02;
  *(undefined8 *)(in_RDI + 200) = extraout_XMM0_Qb_02;
  *(__m128i **)(in_RDI + 0xb0) = palVar1;
  *(__m128i **)(in_RDI + 0xb8) = palVar2;
  in0_03[0] = in_RDI + 0x100;
  in0_03[1] = in_RDI + 0x170;
  in1_03[1] = (longlong)in_R8;
  in1_03[0] = in_RCX;
  addsub_sse4_1(in0_03,in1_03,in_R9,out1,palVar1,palVar2);
  in0_04[0] = in_RDI + 0x110;
  in0_04[1] = in_RDI + 0x160;
  in1_04[1] = (longlong)in_R8;
  in1_04[0] = in_RCX;
  addsub_sse4_1(in0_04,in1_04,in_R9,out1,palVar1,palVar2);
  in0_05[0] = in_RDI + 0x120;
  in0_05[1] = in_RDI + 0x150;
  in1_05[1] = (longlong)in_R8;
  in1_05[0] = in_RCX;
  addsub_sse4_1(in0_05,in1_05,in_R9,out1,palVar1,palVar2);
  in0_06[0] = in_RDI + 0x130;
  in0_06[1] = in_RDI + 0x140;
  in1_06[1] = (longlong)in_R8;
  in1_06[0] = in_RCX;
  addsub_sse4_1(in0_06,in1_06,in_R9,out1,palVar1,palVar2);
  in0_07[0] = in_RDI + 0x1f0;
  in0_07[1] = in_RDI + 0x180;
  in1_07[1] = (longlong)in_R8;
  in1_07[0] = in_RCX;
  addsub_sse4_1(in0_07,in1_07,in_R9,out1,palVar1,palVar2);
  in0_08[0] = in_RDI + 0x1e0;
  in0_08[1] = in_RDI + 400;
  in1_08[1] = (longlong)in_R8;
  in1_08[0] = in_RCX;
  addsub_sse4_1(in0_08,in1_08,in_R9,out1,palVar1,palVar2);
  in0_09[0] = in_RDI + 0x1d0;
  in0_09[1] = in_RDI + 0x1a0;
  in1_09[1] = (longlong)in_R8;
  in1_09[0] = in_RCX;
  addsub_sse4_1(in0_09,in1_09,in_R9,out1,palVar1,palVar2);
  in0_10[0] = in_RDI + 0x1c0;
  in0_10[1] = in_RDI + 0x1b0;
  in1_10[1] = (longlong)in_R8;
  in1_10[0] = in_RCX;
  addsub_sse4_1(in0_10,in1_10,in_R9,out1,palVar1,palVar2);
  return;
}

Assistant:

static inline void idct32_stage7_sse4_1(__m128i *bf1, const __m128i *cospim32,
                                        const __m128i *cospi32,
                                        const __m128i *clamp_lo,
                                        const __m128i *clamp_hi,
                                        const __m128i *rounding, int bit) {
  __m128i temp1, temp2;
  addsub_sse4_1(bf1[0], bf1[7], bf1 + 0, bf1 + 7, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[1], bf1[6], bf1 + 1, bf1 + 6, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[2], bf1[5], bf1 + 2, bf1 + 5, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[3], bf1[4], bf1 + 3, bf1 + 4, clamp_lo, clamp_hi);

  temp1 = half_btf_sse4_1(cospim32, &bf1[10], cospi32, &bf1[13], rounding, bit);
  bf1[13] =
      half_btf_sse4_1(cospi32, &bf1[10], cospi32, &bf1[13], rounding, bit);
  bf1[10] = temp1;
  temp2 = half_btf_sse4_1(cospim32, &bf1[11], cospi32, &bf1[12], rounding, bit);
  bf1[12] =
      half_btf_sse4_1(cospi32, &bf1[11], cospi32, &bf1[12], rounding, bit);
  bf1[11] = temp2;

  addsub_sse4_1(bf1[16], bf1[23], bf1 + 16, bf1 + 23, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[17], bf1[22], bf1 + 17, bf1 + 22, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[18], bf1[21], bf1 + 18, bf1 + 21, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[19], bf1[20], bf1 + 19, bf1 + 20, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[31], bf1[24], bf1 + 31, bf1 + 24, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[30], bf1[25], bf1 + 30, bf1 + 25, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[29], bf1[26], bf1 + 29, bf1 + 26, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[28], bf1[27], bf1 + 28, bf1 + 27, clamp_lo, clamp_hi);
}